

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O0

void __thiscall
Js::JavascriptPromiseResolveThenableTaskFunction::MarshalToScriptContext
          (JavascriptPromiseResolveThenableTaskFunction *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  undefined4 *puVar4;
  ScriptContext *scriptContext_local;
  JavascriptPromiseResolveThenableTaskFunction *this_local;
  
  pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  if (pSVar3 == scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptPromise.h"
                                ,0x4b,"(this->GetScriptContext() != scriptContext)",
                                "this->GetScriptContext() != scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = VirtualTableInfo<Js::JavascriptPromiseResolveThenableTaskFunction>::HasVirtualTable(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptPromise.h"
                                ,0x4b,
                                "(VirtualTableInfo<JavascriptPromiseResolveThenableTaskFunction>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal to script context");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptPromiseResolveThenableTaskFunction>_>::
  SetVirtualTable(this);
  return;
}

Assistant:

JavascriptPromiseResolveThenableTaskFunction(DynamicType* type, FunctionInfo* functionInfo, JavascriptPromise* promise, RecyclableObject* thenable, RecyclableObject* thenFunction)
            : RuntimeFunction(type, functionInfo), promise(promise), thenable(thenable), thenFunction(thenFunction)
        { }